

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O3

shared_ptr<Guild_Create> __thiscall GuildManager::GetCreate(GuildManager *this,string *tag)

{
  iterator iVar1;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<Guild_Create> sVar3;
  string local_40;
  
  util::uppercase(&local_40,in_RDX);
  std::__cxx11::string::operator=((string *)in_RDX,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(tag + 2),in_RDX);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    *(undefined8 *)this = 0;
    (this->cache)._M_h._M_buckets = (__buckets_ptr)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::__shared_ptr<Guild_Create,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Guild_Create,void>
              ((__shared_ptr<Guild_Create,(__gnu_cxx::_Lock_policy)2> *)this,
               (__weak_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<Guild_Create>_>,_true>
                      ._M_cur + 0x28));
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
  ;
  sVar3.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Guild_Create>)
         sVar3.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Guild_Create> GuildManager::GetCreate(std::string tag)
{
	tag = util::uppercase(tag);

	std::unordered_map<std::string, std::weak_ptr<Guild_Create>>::iterator findcreate = this->create_cache.find(tag);

	if (findcreate != this->create_cache.end())
	{
		return std::shared_ptr<Guild_Create>(findcreate->second);
	}
	else
	{
		return std::shared_ptr<Guild_Create>();
	}
}